

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

void __thiscall md::Code::add_long(Code *this,uint32_t longword)

{
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  
  local_1b = (uchar)(longword >> 0x18);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_1b);
  local_1a = (uchar)(longword >> 0x10);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_1a);
  local_1c = (uchar)(longword >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_1c);
  local_19 = (uchar)longword;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_19);
  return;
}

Assistant:

void Code::add_long(uint32_t longword)
{
    this->add_word(static_cast<uint16_t>(longword >> 16));
    this->add_word(static_cast<uint16_t>(longword & 0xFFFF));
}